

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar2;
  undefined4 uVar5;
  ldmParams_t params_00;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_compressionParameters cParams;
  ZSTD_window_t w;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ZSTD_cwksp *ws_00;
  size_t sVar20;
  size_t sVar21;
  size_t code;
  size_t sVar22;
  ZSTD_compressedBlockState_t *pZVar23;
  U32 *pUVar24;
  seqDef *psVar25;
  long lVar26;
  ldmEntry_t *plVar27;
  rawSeq *prVar28;
  ZSTD_Sequence *pZVar29;
  BYTE *pBVar30;
  size_t bytes;
  bool bVar31;
  undefined4 in_stack_fffffffffffffed4;
  ZSTD_strategy in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  U64 local_100;
  ulong local_f8;
  U64 local_f0;
  size_t numBuckets;
  size_t maxNbExternalSeq;
  size_t ldmHSize;
  size_t err_code_2;
  size_t err_code_1;
  int workspaceWasteful;
  int workspaceTooSmall;
  size_t err_code;
  int resizeWorkspace;
  size_t neededSpace;
  ZSTD_indexResetPolicy_e needsIndexReset;
  int dictTooBig;
  int indexTooClose;
  size_t maxNbLdmSeq;
  size_t buffInSize;
  size_t buffOutSize;
  size_t maxNbSeq;
  size_t blockSize;
  size_t windowSize;
  ZSTD_cwksp *ws;
  ZSTD_buffered_policy_e zbuff_local;
  ZSTD_compResetPolicy_e crp_local;
  size_t loadedDictSize_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_CCtx *zc_local;
  
  ws_00 = &zc->workspace;
  uVar9 = (params->cParams).hashLog;
  uVar10 = (params->cParams).searchLog;
  uVar11 = (params->cParams).minMatch;
  uVar12 = (params->cParams).targetLength;
  uVar13 = (params->cParams).strategy;
  cParams.minMatch = uVar13;
  cParams.searchLog = uVar12;
  cParams.hashLog = uVar11;
  cParams.chainLog = uVar10;
  cParams.windowLog = uVar9;
  cParams.targetLength = in_stack_fffffffffffffed4;
  cParams.strategy = in_stack_fffffffffffffed8;
  sVar20 = ZSTD_checkCParams(cParams);
  uVar17 = ERR_isError(sVar20);
  if (uVar17 != 0) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x806,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xd0);
  if ((zc->appliedParams).useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x810,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).useBlockSplitter == ZSTD_ps_auto) {
    __assert_fail("params->useBlockSplitter != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x811,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_auto) {
    __assert_fail("params->ldmParams.enableLdm != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x812,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).maxBlockSize == 0) {
    __assert_fail("params->maxBlockSize != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x813,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(&(zc->appliedParams).ldmParams,&(zc->appliedParams).cParams);
    if ((zc->appliedParams).ldmParams.hashLog < (zc->appliedParams).ldmParams.bucketSizeLog) {
      __assert_fail("params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x817,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < (zc->appliedParams).ldmParams.hashRateLog) {
      __assert_fail("params->ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x818,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
  }
  local_f0 = pledgedSrcSize;
  if ((ulong)(1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f)) < pledgedSrcSize) {
    local_f0 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  }
  if (local_f0 == 0) {
    local_f8 = 1;
  }
  else {
    local_100 = pledgedSrcSize;
    if ((ulong)(1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f)) < pledgedSrcSize) {
      local_100 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
    }
    local_f8 = local_100;
  }
  if ((zc->appliedParams).maxBlockSize < local_f8) {
    local_108 = (zc->appliedParams).maxBlockSize;
  }
  else {
    local_108 = local_f8;
  }
  sVar20 = ZSTD_maxNbSeq(local_108,(zc->appliedParams).cParams.minMatch,
                         (zc->appliedParams).useSequenceProducer);
  if ((zbuff == ZSTDb_buffered) && ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered)) {
    local_110 = ZSTD_compressBound(local_108);
    local_110 = local_110 + 1;
  }
  else {
    local_110 = 0;
  }
  if ((zbuff == ZSTDb_buffered) && ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered)) {
    local_118 = local_f8 + local_108;
  }
  else {
    local_118 = 0;
  }
  uVar3 = (zc->appliedParams).ldmParams.minMatchLength;
  uVar6 = (zc->appliedParams).ldmParams.enableLdm;
  uVar7 = (zc->appliedParams).ldmParams.hashLog;
  uVar8 = (zc->appliedParams).ldmParams.bucketSizeLog;
  params_00.bucketSizeLog = uVar8;
  params_00.hashLog = uVar7;
  params_00.enableLdm = uVar6;
  uVar1 = (zc->appliedParams).ldmParams.hashRateLog;
  uVar4 = (zc->appliedParams).ldmParams.windowLog;
  params_00.windowLog = uVar4;
  params_00.hashRateLog = uVar1;
  params_00.minMatchLength = uVar3;
  sVar21 = ZSTD_ldm_getMaxNbSeq(params_00,local_108);
  uVar2 = *(undefined8 *)&(zc->blockState).matchState.window.nbOverflowCorrections;
  uVar5 = (zc->blockState).matchState.window.lowLimit;
  uVar14 = (zc->blockState).matchState.window.base;
  uVar15 = (zc->blockState).matchState.window.dictBase;
  uVar16 = (zc->blockState).matchState.window.dictLimit;
  w.dictBase._0_4_ = uVar16;
  w.base = (BYTE *)uVar15;
  w.nextSrc = (BYTE *)uVar14;
  w.dictBase._4_4_ = uVar5;
  w.dictLimit = (int)uVar2;
  w.lowLimit = (int)((ulong)uVar2 >> 0x20);
  w._32_6_ = in_stack_fffffffffffffee0;
  w._38_1_ = in_stack_fffffffffffffee6;
  w._39_1_ = in_stack_fffffffffffffee7;
  iVar18 = ZSTD_indexTooCloseToMax(w);
  iVar19 = ZSTD_dictTooBig(loadedDictSize);
  bVar31 = true;
  if ((iVar18 == 0) && (bVar31 = true, iVar19 == 0)) {
    bVar31 = zc->initialized == 0;
  }
  neededSpace._4_4_ = (ZSTD_indexResetPolicy_e)bVar31;
  code = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                   (&(zc->appliedParams).cParams,&(zc->appliedParams).ldmParams,
                    (uint)(zc->staticSize != 0),(zc->appliedParams).useRowMatchFinder,local_118,
                    local_110,pledgedSrcSize,(zc->appliedParams).useSequenceProducer,
                    (zc->appliedParams).maxBlockSize);
  uVar17 = ERR_isError(code);
  if (uVar17 != 0) {
    return code;
  }
  if (zc->staticSize == 0) {
    ZSTD_cwksp_bump_oversized_duration(ws_00,0);
  }
  sVar22 = ZSTD_cwksp_sizeof(ws_00);
  iVar18 = ZSTD_cwksp_check_wasteful(ws_00,code);
  if (sVar22 < code || iVar18 != 0) {
    if (zc->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    neededSpace._4_4_ = ZSTDirp_reset;
    customMem.customFree._4_4_ = (int)((ulong)(zc->customMem).customFree >> 0x20);
    customMem._0_12_ = *(undefined1 (*) [12])&zc->customMem;
    customMem.opaque = (zc->customMem).opaque;
    ZSTD_cwksp_free(ws_00,customMem);
    customMem_00.customFree._4_4_ = (int)((ulong)(zc->customMem).customFree >> 0x20);
    customMem_00._0_12_ = *(undefined1 (*) [12])&zc->customMem;
    customMem_00.opaque = (zc->customMem).opaque;
    sVar22 = ZSTD_cwksp_create(ws_00,code,customMem_00);
    uVar17 = ERR_isError(sVar22);
    if (uVar17 != 0) {
      return sVar22;
    }
    iVar18 = ZSTD_cwksp_check_available(ws_00,0x2c00);
    if (iVar18 == 0) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x84c,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar23 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,0x1600);
    (zc->blockState).prevCBlock = pZVar23;
    if ((zc->blockState).prevCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar23 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,0x1600);
    (zc->blockState).nextCBlock = pZVar23;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar24 = (U32 *)ZSTD_cwksp_reserve_object(ws_00,0x22d8);
    zc->entropyWorkspace = pUVar24;
    if (zc->entropyWorkspace == (U32 *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  ZSTD_cwksp_clear(ws_00);
  uVar17 = (zc->appliedParams).cParams.chainLog;
  (zc->blockState).matchState.cParams.windowLog = (zc->appliedParams).cParams.windowLog;
  (zc->blockState).matchState.cParams.chainLog = uVar17;
  uVar17 = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.hashLog = (zc->appliedParams).cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = uVar17;
  uVar17 = (zc->appliedParams).cParams.targetLength;
  (zc->blockState).matchState.cParams.minMatch = (zc->appliedParams).cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = uVar17;
  (zc->blockState).matchState.cParams.strategy = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize == 0xffffffffffffffff) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = local_108;
  ZSTD_XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  zc_local = (ZSTD_CCtx *)
             ZSTD_reset_matchState
                       (&(zc->blockState).matchState,ws_00,&(zc->appliedParams).cParams,
                        (zc->appliedParams).useRowMatchFinder,crp,neededSpace._4_4_,
                        ZSTD_resetTarget_CCtx);
  uVar17 = ERR_isError((size_t)zc_local);
  if (uVar17 == 0) {
    psVar25 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws_00,sVar20 << 3);
    (zc->seqStore).sequencesStart = psVar25;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      lVar26 = 1L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
      plVar27 = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws_00,lVar26 << 3);
      (zc->ldmState).hashTable = plVar27;
      memset((zc->ldmState).hashTable,0,lVar26 << 3);
      prVar28 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws_00,sVar21 * 0xc);
      zc->ldmSequences = prVar28;
      zc->maxNbLdmSequences = sVar21;
      ZSTD_window_init(&(zc->ldmState).window);
      (zc->ldmState).loadedDictEnd = 0;
    }
    if ((zc->appliedParams).useSequenceProducer != 0) {
      sVar21 = ZSTD_sequenceBound(local_108);
      (zc->externalMatchCtx).seqBufferCapacity = sVar21;
      pZVar29 = (ZSTD_Sequence *)ZSTD_cwksp_reserve_aligned(ws_00,sVar21 << 4);
      (zc->externalMatchCtx).seqBuffer = pZVar29;
    }
    pBVar30 = ZSTD_cwksp_reserve_buffer(ws_00,local_108 + 0x20);
    (zc->seqStore).litStart = pBVar30;
    (zc->seqStore).maxNbLit = local_108;
    zc->bufferedPolicy = zbuff;
    zc->inBuffSize = local_118;
    pBVar30 = ZSTD_cwksp_reserve_buffer(ws_00,local_118);
    zc->inBuff = (char *)pBVar30;
    zc->outBuffSize = local_110;
    pBVar30 = ZSTD_cwksp_reserve_buffer(ws_00,local_110);
    zc->outBuff = (char *)pBVar30;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      bytes = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                     (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
      pBVar30 = ZSTD_cwksp_reserve_buffer(ws_00,bytes);
      (zc->ldmState).bucketOffsets = pBVar30;
      memset((zc->ldmState).bucketOffsets,0,bytes);
    }
    ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
    (zc->seqStore).maxNbSeq = sVar20;
    pBVar30 = ZSTD_cwksp_reserve_buffer(ws_00,sVar20);
    (zc->seqStore).llCode = pBVar30;
    pBVar30 = ZSTD_cwksp_reserve_buffer(ws_00,sVar20);
    (zc->seqStore).mlCode = pBVar30;
    pBVar30 = ZSTD_cwksp_reserve_buffer(ws_00,sVar20);
    (zc->seqStore).ofCode = pBVar30;
    iVar18 = ZSTD_cwksp_estimated_space_within_bounds(ws_00,code);
    if (iVar18 == 0) {
      __assert_fail("ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x8aa,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    zc->initialized = 1;
    zc_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, params->useSequenceProducer);
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, params->useSequenceProducer, params->maxBlockSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (params->useSequenceProducer) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->externalMatchCtx.seqBufferCapacity = maxNbExternalSeq;
            zc->externalMatchCtx.seqBuffer =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}